

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O2

CPToken cp_next(CPState *cp)

{
  SBuf *sb;
  CPChar CVar1;
  byte *pbVar2;
  TValue *pTVar3;
  lua_State *L;
  byte bVar4;
  CTypeID CVar5;
  StrScanFmt SVar6;
  uint uVar7;
  uint uVar8;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar9;
  uint uVar10;
  char *pcVar11;
  GCstr *pGVar12;
  int iVar13;
  ErrMsg em;
  char cVar14;
  int iVar15;
  CPToken c;
  TValue local_38;
  
  sb = &cp->sb;
  (cp->sb).p.ptr32 = (cp->sb).b.ptr32;
LAB_00135cca:
  uVar10 = cp->c;
  if ((char)""[(long)(int)uVar10 + 1] < '\0') goto LAB_00135e18;
  switch(uVar10) {
  case 0x20:
    goto switchD_00135d13_caseD_20;
  case 0x21:
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    bVar4 = *pbVar2;
    uVar10 = (uint)bVar4;
    cp->c = (uint)bVar4;
    if (bVar4 == 0x5c) {
      uVar10 = cp_get_bs(cp);
    }
    if (uVar10 != 0x3d) {
      uVar10 = 0x21;
      goto LAB_001366a1;
    }
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    bVar4 = *pbVar2;
    cp->c = (uint)bVar4;
    uVar10 = 0x107;
    break;
  case 0x22:
  case 0x27:
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    uVar8 = (uint)*pbVar2;
    cp->c = uVar8;
    if (uVar8 == 0x5c) {
      cp_get_bs(cp);
    }
    goto LAB_0013600f;
  case 0x23:
  case 0x25:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2e:
switchD_00135d13_caseD_23:
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    bVar4 = *pbVar2;
    cp->c = (uint)bVar4;
    break;
  case 0x24:
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    bVar4 = *pbVar2;
    uVar10 = (uint)bVar4;
    cp->c = (uint)bVar4;
    if (bVar4 == 0x5c) {
      uVar10 = cp_get_bs(cp);
    }
    if ((uVar10 == 0x24) || ((char)""[(long)(int)uVar10 + 1] < '\0')) {
      em = LJ_ERR_XSYNTAX;
      goto LAB_00136758;
    }
    pTVar3 = cp->param;
    if ((pTVar3 == (TValue *)0x0) || (L = cp->L, L->top <= pTVar3)) {
      cp_err(cp,LJ_ERR_FFI_NUMPARAM);
    }
    cp->param = pTVar3 + 1;
    uVar10 = (pTVar3->field_2).it;
    if (uVar10 == 0xfffffffb) {
      cp->str = (GCstr *)(ulong)(pTVar3->u32).lo;
      (cp->val).id = 0;
      cp->ct = cp->cts->tab;
      uVar10 = 0x100;
      goto LAB_001366a1;
    }
    if (uVar10 < 0xffff0000) {
      aVar9.i32 = (int32_t)pTVar3->n;
      goto LAB_0013660b;
    }
    if (uVar10 != 0xfffffff5) {
      lj_err_argtype(L,(int)((ulong)((long)pTVar3 - (long)L->base) >> 3) + 1,"type parameter");
    }
    uVar10 = (uint)*(ushort *)((ulong)(pTVar3->u32).lo + 6);
    if (uVar10 == 0x15) {
      (cp->val).id = *(CTypeID *)((ulong)(pTVar3->u32).lo + 8);
    }
    else {
      (cp->val).id = uVar10;
    }
    uVar10 = 0x24;
    goto LAB_001366a1;
  case 0x26:
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    bVar4 = *pbVar2;
    uVar10 = (uint)bVar4;
    cp->c = (uint)bVar4;
    if (bVar4 == 0x5c) {
      uVar10 = cp_get_bs(cp);
    }
    if (uVar10 != 0x26) {
      uVar10 = 0x26;
      goto LAB_001366a1;
    }
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    bVar4 = *pbVar2;
    cp->c = (uint)bVar4;
    uVar10 = 0x105;
    break;
  case 0x2d:
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    bVar4 = *pbVar2;
    uVar10 = (uint)bVar4;
    cp->c = (uint)bVar4;
    if (bVar4 == 0x5c) {
      uVar10 = cp_get_bs(cp);
    }
    if (uVar10 != 0x3e) {
      uVar10 = 0x2d;
      goto LAB_001366a1;
    }
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    bVar4 = *pbVar2;
    cp->c = (uint)bVar4;
    uVar10 = 0x10c;
    break;
  case 0x2f:
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    bVar4 = *pbVar2;
    uVar10 = (uint)bVar4;
    cp->c = (uint)bVar4;
    if (bVar4 == 0x5c) {
      uVar10 = cp_get_bs(cp);
    }
    if (uVar10 != 0x2a) {
      if (cp->c == 0x2f) goto LAB_00135dcf;
      uVar10 = 0x2f;
      goto LAB_001366a1;
    }
    do {
      pbVar2 = (byte *)cp->p;
      cp->p = (char *)(pbVar2 + 1);
      bVar4 = *pbVar2;
      uVar10 = (uint)bVar4;
      cp->c = (uint)bVar4;
      if (bVar4 == 0x5c) {
        uVar10 = cp_get_bs(cp);
      }
      if (uVar10 == 0x2a) {
        do {
          pbVar2 = (byte *)cp->p;
          cp->p = (char *)(pbVar2 + 1);
          bVar4 = *pbVar2;
          uVar10 = (uint)bVar4;
          cp->c = (uint)bVar4;
          if (bVar4 == 0x5c) {
            uVar10 = cp_get_bs(cp);
          }
          if (uVar10 == 0x2f) goto switchD_00135d13_caseD_20;
          iVar15 = cp->c;
        } while (iVar15 == 0x2a);
      }
      else {
        iVar15 = cp->c;
      }
      if ((iVar15 == 0xd) || (iVar15 == 10)) {
        cp_newline(cp);
        iVar15 = cp->c;
      }
    } while (iVar15 != 0);
    goto LAB_00135cca;
  default:
    if ((1 < uVar10 - 0xb) && (uVar10 != 9)) {
      if ((uVar10 != 10) && (uVar10 != 0xd)) {
        if (uVar10 == 0) {
          uVar10 = 0x103;
          goto LAB_001366a1;
        }
        if (uVar10 == 0x3c) {
          pbVar2 = (byte *)cp->p;
          cp->p = (char *)(pbVar2 + 1);
          bVar4 = *pbVar2;
          uVar10 = (uint)bVar4;
          cp->c = (uint)bVar4;
          if (bVar4 == 0x5c) {
            uVar10 = cp_get_bs(cp);
          }
          if (uVar10 == 0x3d) {
            pbVar2 = (byte *)cp->p;
            cp->p = (char *)(pbVar2 + 1);
            bVar4 = *pbVar2;
            cp->c = (uint)bVar4;
            uVar10 = 0x108;
          }
          else {
            if (cp->c != 0x3c) {
              uVar10 = 0x3c;
              goto LAB_001366a1;
            }
            pbVar2 = (byte *)cp->p;
            cp->p = (char *)(pbVar2 + 1);
            bVar4 = *pbVar2;
            cp->c = (uint)bVar4;
            uVar10 = 0x10a;
          }
        }
        else if (uVar10 == 0x3d) {
          pbVar2 = (byte *)cp->p;
          cp->p = (char *)(pbVar2 + 1);
          bVar4 = *pbVar2;
          uVar10 = (uint)bVar4;
          cp->c = (uint)bVar4;
          if (bVar4 == 0x5c) {
            uVar10 = cp_get_bs(cp);
          }
          if (uVar10 != 0x3d) {
            uVar10 = 0x3d;
            goto LAB_001366a1;
          }
          pbVar2 = (byte *)cp->p;
          cp->p = (char *)(pbVar2 + 1);
          bVar4 = *pbVar2;
          cp->c = (uint)bVar4;
          uVar10 = 0x106;
        }
        else {
          if (uVar10 != 0x3e) {
            if (uVar10 != 0x7c) goto switchD_00135d13_caseD_23;
            pbVar2 = (byte *)cp->p;
            cp->p = (char *)(pbVar2 + 1);
            bVar4 = *pbVar2;
            uVar10 = (uint)bVar4;
            cp->c = (uint)bVar4;
            if (bVar4 == 0x5c) {
              uVar10 = cp_get_bs(cp);
            }
            if (uVar10 == 0x7c) {
              pbVar2 = (byte *)cp->p;
              cp->p = (char *)(pbVar2 + 1);
              bVar4 = *pbVar2;
              cp->c = (uint)bVar4;
              uVar10 = 0x104;
              break;
            }
            uVar10 = 0x7c;
            goto LAB_001366a1;
          }
          pbVar2 = (byte *)cp->p;
          cp->p = (char *)(pbVar2 + 1);
          bVar4 = *pbVar2;
          uVar10 = (uint)bVar4;
          cp->c = (uint)bVar4;
          if (bVar4 == 0x5c) {
            uVar10 = cp_get_bs(cp);
          }
          if (uVar10 == 0x3d) {
            pbVar2 = (byte *)cp->p;
            cp->p = (char *)(pbVar2 + 1);
            bVar4 = *pbVar2;
            cp->c = (uint)bVar4;
            uVar10 = 0x109;
          }
          else {
            if (cp->c != 0x3e) {
              uVar10 = 0x3e;
              goto LAB_001366a1;
            }
            pbVar2 = (byte *)cp->p;
            cp->p = (char *)(pbVar2 + 1);
            bVar4 = *pbVar2;
            cp->c = (uint)bVar4;
            uVar10 = 0x10b;
          }
        }
        break;
      }
      cp_newline(cp);
    }
switchD_00135d13_caseD_20:
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    uVar10 = (uint)*pbVar2;
    cp->c = uVar10;
    if (uVar10 == 0x5c) {
      cp_get_bs(cp);
    }
    goto LAB_00135cca;
  }
  if (bVar4 == 0x5c) {
    cp_get_bs(cp);
  }
  goto LAB_001366a1;
LAB_00135dcf:
  do {
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    bVar4 = *pbVar2;
    uVar10 = (uint)bVar4;
    cp->c = (uint)bVar4;
    if (bVar4 == 0x5c) {
      uVar10 = cp_get_bs(cp);
    }
  } while (((uVar10 != 10) && (uVar10 != 0xd)) && (cp->c != 0));
  goto LAB_00135cca;
LAB_0013600f:
  uVar8 = cp->c;
  if (uVar8 == uVar10) goto LAB_0013635f;
  if (uVar8 != 0x5c) {
    if (uVar8 != 0) goto switchD_0013607b_caseD_61;
LAB_0013674b:
    uVar10 = 0x103;
    em = LJ_ERR_XSTR;
    goto LAB_00136758;
  }
  pbVar2 = (byte *)cp->p;
  cp->p = (char *)(pbVar2 + 1);
  bVar4 = *pbVar2;
  uVar7 = (uint)bVar4;
  cp->c = (uint)bVar4;
  if (bVar4 == 0x5c) {
    uVar7 = cp_get_bs(cp);
  }
  switch(uVar7) {
  case 0x6e:
    uVar8 = 10;
    break;
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x75:
  case 0x77:
    goto switchD_0013605a_caseD_6f;
  case 0x72:
    uVar8 = 0xd;
    break;
  case 0x74:
    uVar8 = 9;
    break;
  case 0x76:
    uVar8 = 0xb;
    break;
  case 0x78:
    iVar15 = 0;
    while( true ) {
      pbVar2 = (byte *)cp->p;
      cp->p = (char *)(pbVar2 + 1);
      bVar4 = *pbVar2;
      uVar8 = (uint)bVar4;
      cp->c = (uint)bVar4;
      if (bVar4 == 0x5c) {
        uVar8 = cp_get_bs(cp);
      }
      if ((""[(long)(int)uVar8 + 1] & 0x10) == 0) break;
      uVar8 = cp->c;
      iVar13 = (uVar8 & 0xf) + 9;
      if ((""[(long)(int)uVar8 + 1] & 8) != 0) {
        iVar13 = uVar8 - 0x30;
      }
      iVar15 = iVar15 * 0x10 + iVar13;
    }
    uVar8 = (cp->sb).p.ptr32;
    pcVar11 = (char *)(ulong)uVar8;
    if ((cp->sb).e.ptr32 == uVar8) {
      pcVar11 = lj_buf_more2(sb,1);
    }
    iVar13 = (int)pcVar11;
    *pcVar11 = (char)iVar15;
    goto LAB_00136217;
  default:
    uVar8 = 7;
    switch(uVar7) {
    case 0x61:
      break;
    case 0x62:
      uVar8 = 8;
      break;
    case 99:
    case 100:
      goto switchD_0013605a_caseD_6f;
    case 0x65:
      uVar8 = 0x1b;
      break;
    case 0x66:
      uVar8 = 0xc;
      break;
    default:
      if (uVar7 == 0) goto LAB_0013674b;
switchD_0013605a_caseD_6f:
      uVar8 = uVar7;
      if ((""[(long)(int)uVar7 + 1] & 8) == 0) break;
      pbVar2 = (byte *)cp->p;
      cp->p = (char *)(pbVar2 + 1);
      bVar4 = *pbVar2;
      uVar8 = (uint)bVar4;
      cp->c = (uint)bVar4;
      if (bVar4 == 0x5c) {
        uVar8 = cp_get_bs(cp);
      }
      cVar14 = (char)uVar7 + -0x30;
      if ((""[(long)(int)uVar8 + 1] & 8) != 0) {
        CVar1 = cp->c;
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar4 = *pbVar2;
        uVar8 = (uint)bVar4;
        cp->c = (uint)bVar4;
        if (bVar4 == 0x5c) {
          uVar8 = cp_get_bs(cp);
        }
        cVar14 = (char)CVar1 + -0x30 + cVar14 * '\b';
        if ((""[(long)(int)uVar8 + 1] & 8) != 0) {
          cVar14 = (char)cp->c + cVar14 * '\b' + -0x30;
          pbVar2 = (byte *)cp->p;
          cp->p = (char *)(pbVar2 + 1);
          uVar8 = (uint)*pbVar2;
          cp->c = uVar8;
          if (uVar8 == 0x5c) {
            cp_get_bs(cp);
          }
        }
      }
      uVar8 = (cp->sb).p.ptr32;
      pcVar11 = (char *)(ulong)uVar8;
      if ((cp->sb).e.ptr32 == uVar8) {
        pcVar11 = lj_buf_more2(sb,1);
      }
      iVar13 = (int)pcVar11;
      *pcVar11 = cVar14;
LAB_00136217:
      (sb->p).ptr32 = iVar13 + 1;
      goto LAB_0013600f;
    }
  }
switchD_0013607b_caseD_61:
  uVar7 = (cp->sb).p.ptr32;
  pcVar11 = (char *)(ulong)uVar7;
  if ((cp->sb).e.ptr32 == uVar7) {
    pcVar11 = lj_buf_more2(sb,1);
  }
  *pcVar11 = (char)uVar8;
  (cp->sb).p.ptr32 = (int)pcVar11 + 1;
  pbVar2 = (byte *)cp->p;
  cp->p = (char *)(pbVar2 + 1);
  uVar8 = (uint)*pbVar2;
  cp->c = uVar8;
  if (uVar8 == 0x5c) {
    cp_get_bs(cp);
  }
  goto LAB_0013600f;
LAB_00135e18:
  if ((""[(long)(int)uVar10 + 1] & 8) == 0) {
    do {
      CVar1 = cp->c;
      uVar10 = (cp->sb).p.ptr32;
      pcVar11 = (char *)(ulong)uVar10;
      if ((cp->sb).e.ptr32 == uVar10) {
        pcVar11 = lj_buf_more2(sb,1);
      }
      *pcVar11 = (char)CVar1;
      (cp->sb).p.ptr32 = (int)pcVar11 + 1;
      pbVar2 = (byte *)cp->p;
      cp->p = (char *)(pbVar2 + 1);
      bVar4 = *pbVar2;
      uVar10 = (uint)bVar4;
      cp->c = (uint)bVar4;
      if (bVar4 == 0x5c) {
        uVar10 = cp_get_bs(cp);
      }
    } while ((char)""[(long)(int)uVar10 + 1] < '\0');
    uVar10 = (cp->sb).b.ptr32;
    pGVar12 = lj_str_new(cp->L,(char *)(ulong)uVar10,(ulong)((cp->sb).p.ptr32 - uVar10));
    cp->str = pGVar12;
    CVar5 = lj_ctype_getname(cp->cts,&cp->ct,pGVar12,cp->tmask);
    (cp->val).id = CVar5;
    uVar8 = cp->ct->info;
    uVar10 = 0x100;
    if ((uVar8 & 0xf0000000) == 0xd0000000) {
      uVar10 = uVar8 & 0xffff;
    }
    goto LAB_001366a1;
  }
  CVar5 = 9;
  do {
    CVar1 = cp->c;
    uVar10 = (cp->sb).p.ptr32;
    pcVar11 = (char *)(ulong)uVar10;
    if ((cp->sb).e.ptr32 == uVar10) {
      pcVar11 = lj_buf_more2(sb,1);
    }
    *pcVar11 = (char)CVar1;
    (cp->sb).p.ptr32 = (int)pcVar11 + 1;
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    bVar4 = *pbVar2;
    uVar10 = (uint)bVar4;
    cp->c = (uint)bVar4;
    if (bVar4 == 0x5c) {
      uVar10 = cp_get_bs(cp);
    }
  } while ((char)""[(long)(int)uVar10 + 1] < '\0');
  uVar10 = (cp->sb).p.ptr32;
  pcVar11 = (char *)(ulong)uVar10;
  if ((cp->sb).e.ptr32 == uVar10) {
    pcVar11 = lj_buf_more2(sb,1);
  }
  *pcVar11 = '\0';
  (cp->sb).p.ptr32 = (int)pcVar11 + 1;
  uVar10 = (cp->sb).b.ptr32;
  SVar6 = lj_strscan_scan((uint8_t *)(ulong)uVar10,(int)pcVar11 + 1 + ~uVar10,&local_38,0x10);
  if (SVar6 == STRSCAN_INT) {
LAB_00135fc8:
    (cp->val).id = CVar5;
  }
  else {
    if (SVar6 == STRSCAN_U32) {
      CVar5 = 10;
      goto LAB_00135fc8;
    }
    if ((cp->mode & 0x20) == 0) {
      uVar10 = 0x102;
      em = LJ_ERR_XNUMBER;
LAB_00136758:
      cp_errmsg(cp,uVar10,em);
    }
  }
  (cp->val).field_0 = (anon_union_4_2_43a9a9ed_for_CPValue_0)local_38.field_2.field_0;
  goto LAB_00136615;
LAB_0013635f:
  pbVar2 = (byte *)cp->p;
  cp->p = (char *)(pbVar2 + 1);
  uVar8 = (uint)*pbVar2;
  cp->c = uVar8;
  if (uVar8 == 0x5c) {
    cp_get_bs(cp);
  }
  if (uVar10 == 0x22) {
    uVar10 = (cp->sb).b.ptr32;
    pGVar12 = lj_str_new(cp->L,(char *)(ulong)uVar10,(ulong)((cp->sb).p.ptr32 - uVar10));
    cp->str = pGVar12;
    uVar10 = 0x101;
    goto LAB_001366a1;
  }
  uVar10 = (cp->sb).b.ptr32;
  if ((cp->sb).p.ptr32 - uVar10 != 1) {
    cp_err_token(cp,0x27);
  }
  aVar9 = (anon_union_4_2_43a9a9ed_for_CPValue_0)(int)*(char *)(ulong)uVar10;
LAB_0013660b:
  (cp->val).field_0 = aVar9;
  (cp->val).id = 9;
LAB_00136615:
  uVar10 = 0x102;
LAB_001366a1:
  cp->tok = uVar10;
  return uVar10;
}

Assistant:

static LJ_NOINLINE CPToken cp_next(CPState *cp)
{
  return (cp->tok = cp_next_(cp));
}